

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void deqp::gles3::Functional::eval_all_bvec3(ShaderEvalContext *c)

{
  ulong uVar1;
  int i;
  long lVar2;
  ulong uVar3;
  float fVar4;
  Vector<bool,_3> res;
  float local_1c [7];
  
  local_1c[0] = c->in[0].m_data[2];
  local_1c[1] = c->in[0].m_data[0];
  local_1c[2] = c->in[0].m_data[1];
  local_1c[5] = 0.0;
  local_1c[3] = 0.0;
  local_1c[4] = 0.0;
  res.m_data[0] = false;
  res.m_data[1] = false;
  res.m_data[2] = false;
  lVar2 = 0;
  do {
    res.m_data[lVar2] =
         local_1c[lVar2 + 3] <= local_1c[lVar2] && local_1c[lVar2] != local_1c[lVar2 + 3];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  if (res.m_data[0] != false) {
    uVar1 = 0;
    do {
      uVar3 = uVar1;
      if (uVar3 == 2) break;
      uVar1 = uVar3 + 1;
    } while (res.m_data[uVar3 + 1] != false);
    if (1 < uVar3) {
      fVar4 = 1.0;
      goto LAB_010f2f5f;
    }
  }
  fVar4 = 0.0;
LAB_010f2f5f:
  (c->color).m_data[0] = fVar4;
  return;
}

Assistant:

Vector<T, 3>			swizzle		(int a, int b, int c) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); return Vector<T, 3>(m_data[a], m_data[b], m_data[c]); }